

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::MergeLayerEdges
          (S2Builder *this,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,
          vector<int,_std::allocator<int>_> *edge_layers)

{
  iterator __position;
  iterator iVar1;
  long lVar2;
  pair<int,_int> pVar3;
  iterator iVar4;
  pointer pvVar5;
  pointer pvVar6;
  pair<int,_int> *__args;
  int *__args_00;
  ulong uVar7;
  long lVar8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var9;
  ulong uVar10;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> order;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_78;
  iterator iStack_70;
  pair<int,_int> *local_68;
  vector<int,std::allocator<int>> *local_58;
  pair<int,_int> local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  local_78._M_current = (pair<int,_int> *)0x0;
  iStack_70._M_current = (pair<int,_int> *)0x0;
  local_68 = (pair<int,_int> *)0x0;
  pvVar5 = (layer_edges->
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (layer_edges->
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = layer_input_edge_ids;
  if (pvVar6 != pvVar5) {
    uVar7 = 0;
    local_58 = (vector<int,std::allocator<int>> *)input_edge_ids;
    local_48 = (vector<int,std::allocator<int>> *)edge_layers;
    local_40 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges;
    do {
      if (pvVar5[uVar7].
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar5[uVar7].
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar10 = 0;
        do {
          local_50.first = (int)uVar7;
          local_50.second = (int)uVar10;
          if (iStack_70._M_current == local_68) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                       iStack_70,&local_50);
          }
          else {
            pVar3.second = local_50.second;
            pVar3.first = local_50.first;
            *iStack_70._M_current = pVar3;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          uVar10 = uVar10 + 1;
          pvVar5 = (layer_edges->
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)pvVar5[uVar7].
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pvVar5[uVar7].
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
        pvVar6 = (layer_edges->
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        edges = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_40;
      }
      edge_layers = (vector<int,_std::allocator<int>_> *)local_48;
      iVar4._M_current = iStack_70._M_current;
      _Var9._M_current = local_78._M_current;
      uVar7 = uVar7 + 1;
      uVar10 = ((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar10 && uVar10 - uVar7 != 0);
    input_edge_ids = (vector<int,_std::allocator<int>_> *)local_58;
    if (local_78._M_current != iStack_70._M_current) {
      lVar8 = (long)iStack_70._M_current - (long)local_78._M_current;
      uVar7 = lVar8 >> 3;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                (local_78,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           )iStack_70._M_current,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                  )layer_edges);
      if (lVar8 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                  (_Var9,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          )iVar4._M_current,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                    )layer_edges);
        input_edge_ids = (vector<int,_std::allocator<int>_> *)local_58;
      }
      else {
        __last._M_current = _Var9._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                  (_Var9,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                    )layer_edges);
        input_edge_ids = (vector<int,_std::allocator<int>_> *)local_58;
        for (; __last._M_current != iVar4._M_current; __last._M_current = __last._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                    (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                             )layer_edges);
        }
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (edges,(long)iStack_70._M_current - (long)local_78._M_current >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (input_edge_ids,(long)iStack_70._M_current - (long)local_78._M_current >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (edge_layers,(long)iStack_70._M_current - (long)local_78._M_current >> 3);
  iVar4._M_current = iStack_70._M_current;
  for (_Var9._M_current = local_78._M_current; _Var9._M_current != iVar4._M_current;
      _Var9._M_current = _Var9._M_current + 1) {
    __args = (pair<int,_int> *)
             ((long)(_Var9._M_current)->second * 8 +
             *(long *)&(layer_edges->
                       super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(_Var9._M_current)->first].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data);
    __position._M_current = *(pair<int,_int> **)((long)edges + 8);
    if (__position._M_current == *(pair<int,_int> **)((long)edges + 0x10)) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>const&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,__position,
                 __args);
    }
    else {
      *__position._M_current = *__args;
      *(long *)((long)edges + 8) = *(long *)((long)edges + 8) + 8;
    }
    __args_00 = (int *)((long)(_Var9._M_current)->second * 4 +
                       *(long *)&(local_38->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(_Var9._M_current)->first].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data);
    iVar1._M_current = *(int **)((long)input_edge_ids + 8);
    if (iVar1._M_current == *(int **)((long)input_edge_ids + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)input_edge_ids,iVar1,__args_00);
    }
    else {
      *iVar1._M_current = *__args_00;
      *(int **)((long)input_edge_ids + 8) = iVar1._M_current + 1;
    }
    iVar1._M_current = *(int **)((long)edge_layers + 8);
    if (iVar1._M_current == *(int **)((long)edge_layers + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)edge_layers,iVar1,&(_Var9._M_current)->first);
    }
    else {
      *iVar1._M_current = (_Var9._M_current)->first;
      *(int **)((long)edge_layers + 8) = iVar1._M_current + 1;
    }
  }
  if (local_78._M_current != (pair<int,_int> *)0x0) {
    operator_delete(local_78._M_current);
  }
  return;
}

Assistant:

void S2Builder::MergeLayerEdges(
    const vector<vector<Edge>>& layer_edges,
    const vector<vector<InputEdgeIdSetId>>& layer_input_edge_ids,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    vector<int>* edge_layers) const {
  vector<LayerEdgeId> order;
  for (int i = 0; i < layer_edges.size(); ++i) {
    for (int e = 0; e < layer_edges[i].size(); ++e) {
      order.push_back(LayerEdgeId(i, e));
    }
  }
  std::sort(order.begin(), order.end(),
    [&layer_edges](const LayerEdgeId& ai, const LayerEdgeId& bi) {
         return StableLessThan(layer_edges[ai.first][ai.second],
                               layer_edges[bi.first][bi.second], ai, bi);
            });
  edges->reserve(order.size());
  input_edge_ids->reserve(order.size());
  edge_layers->reserve(order.size());
  for (const LayerEdgeId& id : order) {
    edges->push_back(layer_edges[id.first][id.second]);
    input_edge_ids->push_back(layer_input_edge_ids[id.first][id.second]);
    edge_layers->push_back(id.first);
  }
}